

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr
xmlNewInputBufferMemory(void *mem,size_t size,xmlParserInputFlags flags,xmlCharEncoding enc)

{
  undefined8 *puVar1;
  xmlBufPtr pxVar2;
  xmlMemIOCtxt *ctxt;
  xmlParserInputBufferPtr ret;
  xmlCharEncoding enc_local;
  xmlParserInputFlags flags_local;
  size_t size_local;
  void *mem_local;
  
  if (((flags & XML_INPUT_BUF_STATIC) == 0) || ((flags & XML_INPUT_BUF_ZERO_TERMINATED) != 0)) {
    ctxt = (xmlMemIOCtxt *)(*xmlMalloc)(0x40);
    if (ctxt == (xmlMemIOCtxt *)0x0) {
      return (xmlParserInputBufferPtr)0x0;
    }
    memset(ctxt,0,0x40);
    *(undefined4 *)&ctxt[3].cur = 0xffffffff;
    pxVar2 = xmlBufCreateMem((xmlChar *)mem,size,(uint)((flags & XML_INPUT_BUF_STATIC) != 0));
    ctxt[2].cur = (char *)pxVar2;
    if (ctxt[2].cur == (char *)0x0) {
      (*xmlFree)(ctxt);
      return (xmlParserInputBufferPtr)0x0;
    }
  }
  else {
    ctxt = (xmlMemIOCtxt *)xmlAllocParserInputBuffer(enc);
    if ((xmlParserInputBufferPtr)ctxt == (xmlParserInputBufferPtr)0x0) {
      return (xmlParserInputBufferPtr)0x0;
    }
    puVar1 = (undefined8 *)(*xmlMalloc)(0x10);
    if (puVar1 == (undefined8 *)0x0) {
      xmlFreeParserInputBuffer((xmlParserInputBufferPtr)ctxt);
      return (xmlParserInputBufferPtr)0x0;
    }
    *puVar1 = mem;
    puVar1[1] = size;
    ((xmlParserInputBufferPtr)ctxt)->context = puVar1;
    ((xmlParserInputBufferPtr)ctxt)->readcallback = xmlMemRead;
    ((xmlParserInputBufferPtr)ctxt)->closecallback = xmlMemClose;
  }
  return (xmlParserInputBufferPtr)ctxt;
}

Assistant:

xmlParserInputBufferPtr
xmlNewInputBufferMemory(const void *mem, size_t size,
                        xmlParserInputFlags flags, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if ((flags & XML_INPUT_BUF_STATIC) &&
        ((flags & XML_INPUT_BUF_ZERO_TERMINATED) == 0)) {
        xmlMemIOCtxt *ctxt;

        /*
         * Static buffer without zero terminator.
         * Stream memory to avoid a copy.
         */
        ret = xmlAllocParserInputBuffer(enc);
        if (ret == NULL)
            return(NULL);

        ctxt = xmlMalloc(sizeof(*ctxt));
        if (ctxt == NULL) {
            xmlFreeParserInputBuffer(ret);
            return(NULL);
        }

        ctxt->cur = mem;
        ctxt->size = size;

        ret->context = ctxt;
        ret->readcallback = xmlMemRead;
        ret->closecallback = xmlMemClose;
    } else {
        ret = xmlMalloc(sizeof(*ret));
        if (ret == NULL)
            return(NULL);
        memset(ret, 0, sizeof(xmlParserInputBuffer));
        ret->compressed = -1;

        ret->buffer = xmlBufCreateMem((const xmlChar *) mem, size,
                                      (flags & XML_INPUT_BUF_STATIC ? 1 : 0));
        if (ret->buffer == NULL) {
            xmlFree(ret);
            return(NULL);
        }
    }

    return(ret);
}